

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathBezierCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  ImVec2 *pIVar1;
  ImVector<ImVec2> *this_00;
  long in_RDI;
  int in_R8D;
  float fVar2;
  ImVec2 IVar3;
  int in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  int i_step;
  float t_step;
  ImVec2 p1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  ImVector<ImVec2> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  int iVar4;
  float fVar5;
  float fVar6;
  
  pIVar1 = ImVector<ImVec2>::back(in_stack_ffffffffffffffb0);
  fVar5 = (*pIVar1).x;
  fVar6 = (*pIVar1).y;
  if (in_R8D == 0) {
    PathBezierToCasteljau
              ((ImVector<ImVec2> *)CONCAT44(num_segments,p1.y),p1.x,t_step,(float)i_step,
               in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014,
               in_stack_00000010,p3._0_4_,in_stack_0000000c);
  }
  else {
    fVar2 = 1.0 / (float)in_R8D;
    for (iVar4 = 1; iVar4 <= in_R8D; iVar4 = iVar4 + 1) {
      this_00 = (ImVector<ImVec2> *)(in_RDI + 0x80);
      IVar3 = ImBezierCalc((ImVec2 *)CONCAT44(in_R8D,fVar6),(ImVec2 *)CONCAT44(fVar5,fVar2),
                           (ImVec2 *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                           (ImVec2 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (float)((ulong)in_RDI >> 0x20));
      in_stack_ffffffffffffffc4 = IVar3.x;
      in_stack_ffffffffffffffc8 = IVar3.y;
      ImVector<ImVec2>::push_back
                (this_00,(ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0); // Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierCalc(p1, p2, p3, p4, t_step * i_step));
    }
}